

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arg.h
# Opt level: O0

Arg * __thiscall TCLAP::Arg::toString_abi_cxx11_(Arg *this)

{
  bool bVar1;
  long in_RSI;
  string local_110 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [54];
  allocator local_1a;
  undefined1 local_19;
  Arg *this_local;
  string *s;
  
  local_19 = 0;
  this_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,"",&local_1a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (in_RSI + 8),"");
  if (bVar1) {
    flagStartString_abi_cxx11_();
    std::operator+(local_70,local_90);
    std::operator+(local_50,(char *)local_70);
    std::__cxx11::string::operator+=((string *)this,(string *)local_50);
    std::__cxx11::string::~string((string *)local_50);
    std::__cxx11::string::~string((string *)local_70);
    std::__cxx11::string::~string((string *)local_90);
  }
  nameStartString_abi_cxx11_();
  std::operator+((char *)local_f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"(");
  std::operator+(local_d0,local_f0);
  std::operator+(local_b0,(char *)local_d0);
  std::__cxx11::string::operator+=((string *)this,(string *)local_b0);
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::~string((string *)local_d0);
  std::__cxx11::string::~string((string *)local_f0);
  std::__cxx11::string::~string(local_110);
  return this;
}

Assistant:

inline std::string Arg::toString() const
{
	std::string s = "";

	if ( _flag != "" )
		s += Arg::flagStartString() + _flag + " ";

	s += "(" + Arg::nameStartString() + _name + ")";

	return s;
}